

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::validate_iterator(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                    *this,const_iterator *it)

{
  pointer_type pcVar1;
  bool bVar2;
  bool bVar3;
  buffer_type *pbVar4;
  buffer_char_pointer pcVar5;
  undefined1 local_28 [8];
  const_iterator *local_18;
  const_iterator *it_local;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  local_18 = it;
  it_local = (const_iterator *)this;
  bVar2 = empty_unsafe(this);
  if (bVar2) {
    cend((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          *)&stack0xffffffffffffffe0);
    bVar2 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
            ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                          *)&stack0xffffffffffffffe0,local_18);
    if (!bVar2) {
      std::terminate();
    }
  }
  else {
    cend((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          *)local_28);
    bVar3 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
            ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                          *)local_28,local_18);
    bVar2 = true;
    if (!bVar3) {
      pbVar4 = buff(this);
      pcVar1 = pbVar4->begin;
      pcVar5 = flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
               ::get_ptr(local_18);
      bVar2 = false;
      if (pcVar1 <= pcVar5) {
        pcVar5 = flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                 ::get_ptr(local_18);
        pbVar4 = buff(this);
        bVar2 = pcVar5 <= pbVar4->last;
      }
    }
    if (!bVar2) {
      std::terminate();
    }
    validate_compare_to_all_valid_elements(this,local_18);
  }
  return;
}

Assistant:

void validate_iterator(const_iterator const &it) const noexcept {
        //
        // If we do not have any valid elements then
        // only end iterator is valid.
        // Otherwise iterator should be an end or point somewhere
        // between begin of the buffer and start of the first element
        //
        if (empty_unsafe()) {
            FFL_CODDING_ERROR_IF_NOT(cend() == it);
        } else {
            FFL_CODDING_ERROR_IF_NOT(cend() == it ||
                                     (buff().begin <= it.get_ptr() && it.get_ptr() <= buff().last));
            validate_compare_to_all_valid_elements(it);
        }
    }